

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strtol.c
# Opt level: O1

long strtol(char *__nptr,char **__endptr,int __base)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int limdigit;
  uintmax_t limval;
  unsigned_long uVar4;
  unsigned_long uVar5;
  uintmax_t error;
  ulong uVar6;
  char sign;
  char *p;
  char local_29;
  char *local_28;
  uint local_1c;
  
  local_29 = '+';
  local_1c = __base;
  local_28 = _PDCLIB_strtox_prelim(__nptr,&local_29,(int *)&local_1c);
  uVar6 = (ulong)(int)local_1c;
  if (local_1c - 0x25 < 0xffffffdd) {
    uVar5 = 0;
  }
  else {
    if (local_29 == '+') {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = uVar6;
      auVar2 = ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff);
      limval = SUB168(auVar2 / auVar1,0);
      limdigit = SUB164(auVar2 % auVar1,0);
      error = 0x7fffffffffffffff;
    }
    else {
      auVar2._8_8_ = 0;
      auVar2._0_8_ = SUB168(SEXT816(-0x8000000000000000),8);
      limval = SUB168((auVar2 << 0x40 | ZEXT816(0x8000000000000000)) / SEXT816((long)-uVar6),0);
      auVar3._8_8_ = 0;
      auVar3._0_8_ = SUB168(SEXT816(-0x8000000000000000),8);
      limdigit = -SUB164((auVar3 << 0x40 | ZEXT816(0x8000000000000000)) % SEXT816((long)uVar6),0);
      error = 0x8000000000000000;
    }
    uVar4 = _PDCLIB_strtox_main(&local_28,local_1c,error,limval,limdigit,&local_29);
    if (__endptr != (char **)0x0) {
      if (local_28 != (char *)0x0) {
        __nptr = local_28;
      }
      *__endptr = __nptr;
    }
    uVar5 = -uVar4;
    if (local_29 == '+') {
      uVar5 = uVar4;
    }
  }
  return uVar5;
}

Assistant:

long int strtol( const char * s, char ** endptr, int base )
{
    long int rc;
    char sign = '+';
    const char * p = _PDCLIB_strtox_prelim( s, &sign, &base );

    if ( base < 2 || base > 36 )
    {
        return 0;
    }

    if ( sign == '+' )
    {
        rc = ( long int )_PDCLIB_strtox_main( &p, ( unsigned )base, ( uintmax_t )LONG_MAX, ( uintmax_t )( LONG_MAX / base ), ( int )( LONG_MAX % base ), &sign );
    }
    else
    {
        rc = ( long int )_PDCLIB_strtox_main( &p, ( unsigned )base, ( uintmax_t )LONG_MIN, ( uintmax_t )( LONG_MIN / -base ), ( int )( -( LONG_MIN % base ) ), &sign );
    }

    if ( endptr != NULL )
    {
        *endptr = ( p != NULL ) ? ( char * ) p : ( char * ) s;
    }

    return ( sign == '+' ) ? rc : -rc;
}